

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_long_fs.c
# Opt level: O1

int check_long_fs(test_state *state)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  
  uVar1 = state->strm->block_size;
  if (1 < (int)uVar1) {
    iVar2 = state->bytes_per_sample;
    uVar4 = (ulong)(uVar1 >> 1);
    lVar3 = 0;
    do {
      (*state->out)(state->ubuf + lVar3,state->xmin,iVar2);
      (*state->out)(state->ubuf + lVar3 + (int)(uVar1 * iVar2) / 2,65000,iVar2);
      lVar3 = lVar3 + iVar2;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  printf("Checking long fs ... ");
  iVar2 = (*state->codec)(state);
  if (iVar2 == 0) {
    puts("\x1b[0;32mPASS\x1b[0m");
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int check_long_fs(struct test_state *state)
{
    int status, size, i, bs;

    size = state->bytes_per_sample;
    bs = state->strm->block_size;

    for (i = 0; i < bs / 2; i++) {
        state->out(state->ubuf + size * i, state->xmin, size);
        state->out(state->ubuf + bs * size / 2 + size * i, 65000, size);
    }

    printf("Checking long fs ... ");

    status = state->codec(state);
    if (status)
        return status;

    printf ("%s\n", CHECK_PASS);
    return 0;
}